

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeConst(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  HeapType HVar2;
  TupleMake *pTVar3;
  Type *pTVar4;
  uintptr_t *puVar5;
  Literal local_88;
  Expression *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  undefined1 local_48 [8];
  Iterator __begin3;
  Type type_local;
  
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = type.id;
  if ((type.id & 1) == 0 && 6 < type.id) {
    if (((this->wasm->features).features & 0x100) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd39,"Expression *wasm::TranslateToFuzzReader::makeConst(Type)");
    }
    if (((type.id & 2) == 0) || (uVar1 = Random::upTo(&this->random,8), uVar1 != 0)) {
      HVar2 = Type::getHeapType((Type *)&__begin3.
                                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         .index);
      if (((uint)HVar2.id & 0x7b) == 0x50 && HVar2.id < 0x7d) {
        pTVar3 = (TupleMake *)makeStringConst(this);
      }
      else {
        HVar2 = Type::getHeapType((Type *)&__begin3.
                                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           .index);
        if (HVar2.id < 0x7d) {
          pTVar3 = (TupleMake *)
                   makeBasicRef(this,(Type)__begin3.
                                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           .index);
        }
        else {
          pTVar3 = (TupleMake *)
                   makeCompoundRef(this,(Type)__begin3.
                                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                              .index);
        }
      }
    }
    else {
      HVar2 = Type::getHeapType((Type *)&__begin3.
                                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         .index);
      pTVar3 = (TupleMake *)Builder::makeRefNull(&this->builder,HVar2);
    }
  }
  else if ((type.id & 1) == 0 || type.id < 7) {
    if (6 < type.id) {
      __assert_fail("type.isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd4d,"Expression *wasm::TranslateToFuzzReader::makeConst(Type)");
    }
    makeLiteral(&local_88,this,type);
    pTVar3 = (TupleMake *)Builder::makeConst(&this->builder,&local_88);
    wasm::Literal::~Literal(&local_88);
  }
  else {
    auStack_68 = (undefined1  [8])0x0;
    operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48 = (undefined1  [8])
               &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    pTVar4 = (Type *)Type::size((Type *)local_48);
    if (pTVar4 != (Type *)0x0) {
      do {
        do {
          puVar5 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_48);
          local_70 = makeConst(this,(Type)*puVar5);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                     &local_70);
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
        } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                 != pTVar4);
      } while (local_48 !=
               (undefined1  [8])
               &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    }
    pTVar3 = Builder::
             makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       (&this->builder,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_68);
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,
                      (long)operands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
    }
  }
  return (Expression *)pTVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeConst(Type type) {
  if (type.isRef()) {
    assert(wasm.features.hasReferenceTypes());
    // With a low chance, just emit a null if that is valid.
    if (type.isNullable() && oneIn(8)) {
      return builder.makeRefNull(type.getHeapType());
    }
    if (type.getHeapType().isString()) {
      return makeStringConst();
    }
    if (type.getHeapType().isBasic()) {
      return makeBasicRef(type);
    } else {
      return makeCompoundRef(type);
    }
  } else if (type.isTuple()) {
    std::vector<Expression*> operands;
    for (const auto& t : type) {
      operands.push_back(makeConst(t));
    }
    return builder.makeTupleMake(std::move(operands));
  } else {
    assert(type.isBasic());
    return builder.makeConst(makeLiteral(type));
  }
}